

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryEnumTypes_Test::
~ValidationErrorTest_MapEntryEnumTypes_Test(ValidationErrorTest_MapEntryEnumTypes_Test *this)

{
  ValidationErrorTest_MapEntryEnumTypes_Test *this_local;
  
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryEnumTypes) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  TextFormat::MergeFromString(
      "enum_type { "
      "  name: 'BarEnum' "
      "  value { name: 'BAR_BAR' number:0 } "
      "} ",
      file_proto.mutable_message_type(0)->mutable_nested_type(0));
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}